

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O2

uint16_t __thiscall
ami_nvar_t::nvar_entry_body_t::extended_header_size_field(nvar_entry_body_t *this)

{
  nvar_attributes_t *pnVar1;
  kstream *this_00;
  uint16_t uVar2;
  uint64_t pos;
  uint64_t uVar3;
  
  if (this->f_extended_header_size_field == false) {
    this->n_extended_header_size_field = true;
    pnVar1 = (this->m__parent->m_attributes)._M_t.
             super___uniq_ptr_impl<ami_nvar_t::nvar_attributes_t,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_ami_nvar_t::nvar_attributes_t_*,_std::default_delete<ami_nvar_t::nvar_attributes_t>_>
             .super__Head_base<0UL,_ami_nvar_t::nvar_attributes_t_*,_false>._M_head_impl;
    if (((pnVar1->m_valid == true) && (pnVar1->m_extended_header == true)) &&
       (0xc < this->m__parent->m_size)) {
      this->n_extended_header_size_field = false;
      pos = kaitai::kstream::pos((this->super_kstruct).m__io);
      this_00 = (this->super_kstruct).m__io;
      uVar3 = kaitai::kstream::pos(this_00);
      kaitai::kstream::seek(this_00,uVar3 - 2);
      uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
      this->m_extended_header_size_field = uVar2;
      kaitai::kstream::seek((this->super_kstruct).m__io,pos);
      this->f_extended_header_size_field = true;
    }
  }
  return this->m_extended_header_size_field;
}

Assistant:

uint16_t ami_nvar_t::nvar_entry_body_t::extended_header_size_field() {
    if (f_extended_header_size_field)
        return m_extended_header_size_field;
    n_extended_header_size_field = true;
    if ( ((_parent()->attributes()->valid()) && (_parent()->attributes()->extended_header()) && (_parent()->size() > (((4 + 2) + 4) + 2))) ) {
        n_extended_header_size_field = false;
        std::streampos _pos = m__io->pos();
        m__io->seek((_io()->pos() - 2));
        m_extended_header_size_field = m__io->read_u2le();
        m__io->seek(_pos);
        f_extended_header_size_field = true;
    }
    return m_extended_header_size_field;
}